

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O2

void Gia_ManTestDistanceInternal(Emb_Man_t *p)

{
  Emb_Obj_t *pEVar1;
  uint uVar2;
  abctime aVar3;
  abctime aVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  
  Gia_ManRandom(1);
  Emb_ManResetTravId(p);
  aVar3 = Abc_Clock();
  pcVar8 = "From inputs: ";
  printf("From inputs: ");
  uVar6 = 0;
  while (iVar7 = (int)pcVar8, uVar6 < 0x14) {
    uVar2 = Gia_ManRandom(0);
    pcVar8 = (char *)p->vCis;
    uVar2 = Vec_IntEntry((Vec_Int_t *)pcVar8,uVar2 % (uint)((Vec_Int_t *)pcVar8)->nSize);
    if ((p->pObjData[(ulong)uVar2 + 1] != 0) &&
       (pEVar1 = (Emb_Obj_t *)(p->pObjData + uVar2),
       0xf < *(uint *)(&pEVar1->field_0x0 +
                      (long)*(int *)(&pEVar1[1].field_0x0 + (ulong)(*(uint *)pEVar1 >> 4) * 4) * 4)
       && (*(uint *)(&pEVar1->field_0x0 +
                    (long)*(int *)(&pEVar1[1].field_0x0 + (ulong)(*(uint *)pEVar1 >> 4) * 4) * 4) &
          3) == 0)) {
      uVar2 = Emb_ManComputeDistance_old(p,pEVar1);
      pcVar8 = "%d ";
      printf("%d ",(ulong)uVar2);
      uVar6 = uVar6 + 1;
    }
  }
  Abc_Print(iVar7,"%s =","Time");
  aVar4 = Abc_Clock();
  Abc_Print(iVar7,"%9.2f sec\n",(double)(aVar4 - aVar3) / 1000000.0);
  aVar3 = Abc_Clock();
  pcVar8 = "From outputs: ";
  printf("From outputs: ");
  uVar6 = 0;
  while (iVar7 = (int)pcVar8, uVar6 < 0x14) {
    uVar2 = Gia_ManRandom(0);
    pcVar8 = (char *)p->vCos;
    uVar2 = Vec_IntEntry((Vec_Int_t *)pcVar8,uVar2 % (uint)((Vec_Int_t *)pcVar8)->nSize);
    pEVar1 = (Emb_Obj_t *)(p->pObjData + uVar2);
    uVar2 = *(uint *)((long)pEVar1 + (long)*(int *)(pEVar1 + 1) * -4);
    if (0xf < uVar2 && (uVar2 & 3) == 0) {
      uVar2 = Emb_ManComputeDistance_old(p,pEVar1);
      pcVar8 = "%d ";
      printf("%d ",(ulong)uVar2);
      uVar6 = uVar6 + 1;
    }
  }
  Abc_Print(iVar7,"%s =","Time");
  aVar4 = Abc_Clock();
  Abc_Print(iVar7,"%9.2f sec\n",(double)(aVar4 - aVar3) / 1000000.0);
  aVar3 = Abc_Clock();
  pcVar8 = "From nodes: ";
  printf("From nodes: ");
  uVar6 = 0;
  while (iVar7 = (int)pcVar8, uVar6 < 0x14) {
    uVar2 = Gia_ManRandom(0);
    pcVar8 = (char *)p->pGia;
    uVar2 = uVar2 % (uint)((Gia_Man_t *)pcVar8)->nObjs;
    pGVar5 = Gia_ManObj((Gia_Man_t *)pcVar8,uVar2);
    if (pGVar5->Value != 0xffffffff) {
      pcVar8 = (char *)p->pGia;
      pGVar5 = Gia_ManObj((Gia_Man_t *)pcVar8,uVar2);
      uVar2 = p->pObjData[pGVar5->Value];
      if (0xf < uVar2 && (uVar2 & 3) == 0) {
        uVar2 = Emb_ManComputeDistance_old(p,(Emb_Obj_t *)(p->pObjData + pGVar5->Value));
        pcVar8 = "%d ";
        printf("%d ",(ulong)uVar2);
        uVar6 = uVar6 + 1;
      }
    }
  }
  Abc_Print(iVar7,"%s =","Time");
  aVar4 = Abc_Clock();
  Abc_Print(iVar7,"%9.2f sec\n",(double)(aVar4 - aVar3) / 1000000.0);
  return;
}

Assistant:

void Gia_ManTestDistanceInternal( Emb_Man_t * p )
{
    int nAttempts = 20;
    int i, iNode, Dist;
    abctime clk;
    Emb_Obj_t * pPivot, * pNext;
    Gia_ManRandom( 1 );
    Emb_ManResetTravId( p );
    // compute distances from several randomly selected PIs
    clk = Abc_Clock();
    printf( "From inputs: " );
    for ( i = 0; i < nAttempts; i++ )
    {
        iNode = Gia_ManRandom( 0 ) % Emb_ManCiNum(p);
        pPivot = Emb_ManCi( p, iNode );
        if ( Emb_ObjFanoutNum(pPivot) == 0 )
            { i--; continue; }
        pNext = Emb_ObjFanout( pPivot, 0 );
        if ( !Emb_ObjIsNode(pNext) )
            { i--; continue; }
        Dist = Emb_ManComputeDistance_old( p, pPivot );
        printf( "%d ", Dist );
    }
    ABC_PRT( "Time", Abc_Clock() - clk );
    // compute distances from several randomly selected POs
    clk = Abc_Clock();
    printf( "From outputs: " );
    for ( i = 0; i < nAttempts; i++ )
    {
        iNode = Gia_ManRandom( 0 ) % Emb_ManCoNum(p);
        pPivot = Emb_ManCo( p, iNode );
        pNext = Emb_ObjFanin( pPivot, 0 );
        if ( !Emb_ObjIsNode(pNext) )
            { i--; continue; }
        Dist = Emb_ManComputeDistance_old( p, pPivot );
        printf( "%d ", Dist );
    }
    ABC_PRT( "Time", Abc_Clock() - clk );
    // compute distances from several randomly selected nodes
    clk = Abc_Clock();
    printf( "From nodes: " );
    for ( i = 0; i < nAttempts; i++ )
    {
        iNode = Gia_ManRandom( 0 ) % Gia_ManObjNum(p->pGia);
        if ( !~Gia_ManObj(p->pGia, iNode)->Value )
            { i--; continue; }
        pPivot = Emb_ManObj( p, Gia_ManObj(p->pGia, iNode)->Value );
        if ( !Emb_ObjIsNode(pPivot) )
            { i--; continue; }
        Dist = Emb_ManComputeDistance_old( p, pPivot );
        printf( "%d ", Dist );
    }
    ABC_PRT( "Time", Abc_Clock() - clk );
}